

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O3

void __thiscall
__gnu_cxx::new_allocator<semver::detail::range_comparator<int,int,int>>::
construct<semver::detail::range_comparator<int,int,int>,semver::detail::range_comparator<int,int,int>>
          (new_allocator<semver::detail::range_comparator<int,int,int>> *this,
          range_comparator<int,_int,_int> *__p,range_comparator<int,_int,_int> *__args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  pointer ppVar5;
  int iVar6;
  
  (__p->v).patch_ = (__args->v).patch_;
  iVar6 = (__args->v).minor_;
  (__p->v).major_ = (__args->v).major_;
  (__p->v).minor_ = iVar6;
  paVar1 = &(__p->v).prerelease_tag_.field_2;
  (__p->v).prerelease_tag_._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->v).prerelease_tag_._M_dataplus._M_p;
  paVar2 = &(__args->v).prerelease_tag_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->v).prerelease_tag_.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->v).prerelease_tag_.field_2 + 8) = uVar4;
  }
  else {
    (__p->v).prerelease_tag_._M_dataplus._M_p = pcVar3;
    (__p->v).prerelease_tag_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->v).prerelease_tag_._M_string_length = (__args->v).prerelease_tag_._M_string_length;
  (__args->v).prerelease_tag_._M_dataplus._M_p = (pointer)paVar2;
  (__args->v).prerelease_tag_._M_string_length = 0;
  (__args->v).prerelease_tag_.field_2._M_local_buf[0] = '\0';
  paVar1 = &(__p->v).build_metadata_.field_2;
  (__p->v).build_metadata_._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (__args->v).build_metadata_._M_dataplus._M_p;
  paVar2 = &(__args->v).build_metadata_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(__args->v).build_metadata_.field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(__p->v).build_metadata_.field_2 + 8) = uVar4;
  }
  else {
    (__p->v).build_metadata_._M_dataplus._M_p = pcVar3;
    (__p->v).build_metadata_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (__p->v).build_metadata_._M_string_length = (__args->v).build_metadata_._M_string_length;
  (__args->v).build_metadata_._M_dataplus._M_p = (pointer)paVar2;
  (__args->v).build_metadata_._M_string_length = 0;
  (__args->v).build_metadata_.field_2._M_local_buf[0] = '\0';
  ppVar5 = (__args->v).prerelease_identifiers.
           super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__p->v).prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (__args->v).prerelease_identifiers.
       super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__p->v).prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar5;
  (__p->v).prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (__args->v).prerelease_identifiers.
       super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (__args->v).prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__args->v).prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__args->v).prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __p->op = __args->op;
  return;
}

Assistant:

SEMVER_CONSTEXPR version(version&&) = default;